

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_test_helper.cpp
# Opt level: O0

string * __thiscall
bidfx_public_api::price::pixie::PriceMapEvent::GetPriceString_abi_cxx11_
          (string *__return_storage_ptr__,PriceMapEvent *this)

{
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  _Self local_1c0;
  _Self local_1b8;
  const_iterator it;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  PriceMapEvent *local_18;
  PriceMapEvent *this_local;
  
  local_18 = this;
  this_local = (PriceMapEvent *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"{");
  local_1b8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::cbegin(&this->price_);
  while( true ) {
    local_1c0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
         ::cend(&this->price_);
    bVar1 = std::operator!=(&local_1b8,&local_1c0);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
             ::operator->(&local_1b8);
    poVar3 = std::operator<<(local_190,(string *)ppVar2);
    poVar3 = std::operator<<(poVar3,"=");
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
             ::operator->(&local_1b8);
    poVar3 = (ostream *)bidfx_public_api::price::operator<<(poVar3,&ppVar2->second);
    std::operator<<(poVar3,", ");
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
    ::operator++(&local_1b8,0);
  }
  std::operator<<(local_190,"}");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string PriceMapEvent::GetPriceString()
{
    std::stringstream ss;
    ss << "{";
    for (auto it = price_.cbegin(); it != price_.cend(); it++)
    {
        ss << (it->first) << "=" << (it->second) << ", ";
    }
    ss << "}";
    return ss.str();
}